

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paper_example_put_array.c
# Opt level: O1

void paper_example_put_array(void)

{
  uint uVar1;
  bsp_pid_t bVar2;
  bsp_pid_t bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  undefined8 uVar9;
  int xs [3];
  uint local_24;
  uint local_20;
  uint local_1c;
  
  bVar2 = bsp_nprocs();
  bsp_begin(bVar2);
  bVar2 = bsp_nprocs();
  bVar3 = bsp_pid();
  iVar4 = bVar2 - bVar3;
  local_24 = iVar4 * 3 - 1;
  local_20 = iVar4 * 3 - 2;
  local_1c = iVar4 * 3 - 3;
  put_array((int *)&local_24,bVar2 * 3);
  uVar8 = (ulong)local_24;
  uVar1 = bVar3 * 3;
  uVar5 = (ulong)uVar1;
  if (local_24 == uVar1) {
    uVar8 = (ulong)local_20;
    if (local_20 == uVar1 + 1) {
      uVar8 = (ulong)local_1c;
      uVar5 = (ulong)(uVar1 + 2);
      if (local_1c == uVar1 + 2) {
        bsp_end();
        return;
      }
      pcVar7 = "xs[2]";
      pcVar6 = "s*3 + 2";
      uVar9 = 0x28;
    }
    else {
      pcVar7 = "xs[1]";
      pcVar6 = "s*3 + 1";
      uVar5 = (ulong)(uVar1 + 1);
      uVar9 = 0x27;
    }
  }
  else {
    pcVar7 = "xs[0]";
    pcVar6 = "s*3";
    uVar9 = 0x26;
  }
  printf("TEST FAILED: Expected %s to be equal to %s = %d but got %d\n   /workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/test/paper_example_put_array.c:%d\n"
         ,pcVar7,pcVar6,uVar5,uVar8,uVar9);
  abort();
}

Assistant:

void put_array( int * xs, int n ) {
    int i, dst_pid, dst_idx;
    int p = bsp_nprocs();
    int n_over_p = n/p;

    if ((n%p) != 0)
        bsp_abort("{put_array} n=%d not divisible by p=%d\n", n, p);
    bsp_push_reg( xs, n_over_p*sizeof(xs[0]));
    bsp_sync();

    for (i = 0; i < n_over_p; ++i) {
        dst_pid = xs[i] / n_over_p;
        dst_idx = xs[i] % n_over_p;
        bsp_put( dst_pid, &xs[i], xs, dst_idx*sizeof(xs[0]), sizeof(xs[0]));
    }
    bsp_sync();
    bsp_pop_reg(xs);
}